

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

void __thiscall glslang::TSymbolTable::pop(TSymbolTable *this,TPrecisionQualifier *p)

{
  pointer ppTVar1;
  
  ppTVar1 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  TSymbolTableLevel::getPreviousDefaultPrecisions
            (ppTVar1[((long)(this->table).
                            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1) * 0x20000000
                     + -0x100000000 >> 0x20],p);
  ppTVar1 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar1[-1] != (TSymbolTableLevel *)0x0) {
    TSymbolTableLevel::~TSymbolTableLevel(ppTVar1[-1]);
    ppTVar1 = (this->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  (this->table).
  super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppTVar1 + -1;
  updateUniqueIdLevelFlag(this);
  return;
}

Assistant:

void pop(TPrecisionQualifier *p)
    {
        table[currentLevel()]->getPreviousDefaultPrecisions(p);
        delete table.back();
        table.pop_back();
        updateUniqueIdLevelFlag();
    }